

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_CustomRailgun
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  AActor *other;
  AActor *pAVar12;
  double x;
  PClass *pPVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined4 extraout_var;
  PClass *pPVar17;
  VMValue *pVVar18;
  VMValue *pVVar19;
  AActor *pAVar20;
  char *pcVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  ulong uVar26;
  AActor *local_198;
  undefined8 local_168;
  undefined1 local_160 [32];
  ulong uStack_140;
  PClassActor *local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  void *local_108;
  void *local_100;
  PClassActor *local_f8;
  void *local_f0;
  double local_e8;
  ulong uStack_e0;
  FTranslatedLineTarget t;
  FRailParams p;
  
  pPVar13 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar21 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      other = *(AActor **)&param->field_0;
      if (other != (AActor *)0x0) {
        if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar14 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar14);
        }
        pPVar17 = (other->super_DThinker).super_DObject.Class;
        bVar22 = pPVar17 != (PClass *)0x0;
        if (pPVar17 != pPVar13 && bVar22) {
          do {
            pPVar17 = pPVar17->ParentClass;
            bVar22 = pPVar17 != (PClass *)0x0;
            if (pPVar17 == pPVar13) break;
          } while (pPVar17 != (PClass *)0x0);
        }
        if (!bVar22) {
          pcVar21 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003cebcd;
        }
      }
      if (numparam == 1) {
        pcVar21 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          iVar14 = param[1].field_0.i;
          if (numparam < 3) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[2].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003cebec;
            }
          }
          else {
            pVVar19 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003cebec:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8cf,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar5 = pVVar19[2].field_0.i;
          if (numparam < 4) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[3].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003cec0b;
            }
          }
          else {
            pVVar19 = param;
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003cec0b:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d0,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar6 = pVVar19[3].field_0.i;
          if (numparam < 5) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[4].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003cec2a;
            }
          }
          else {
            pVVar19 = param;
            if (param[4].field_0.field_3.Type != '\0') {
              pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003cec2a:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d1,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar7 = pVVar19[4].field_0.i;
          if (numparam < 6) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[5].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003cec49;
            }
          }
          else {
            pVVar19 = param;
            if (param[5].field_0.field_3.Type != '\0') {
              pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003cec49:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d2,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          uVar8 = pVVar19[5].field_0.i;
          if (numparam < 7) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[6].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003cec68;
            }
          }
          else {
            pVVar19 = param;
            if (param[6].field_0.field_3.Type != '\0') {
              pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003cec68:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d3,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar9 = pVVar19[6].field_0.i;
          if (numparam < 8) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[7].field_0.field_3.Type != '\x01') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003cec87;
            }
          }
          else {
            pVVar19 = param;
            if (param[7].field_0.field_3.Type != '\x01') {
              pcVar21 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cec87:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d4,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_f0 = pVVar19[7].field_0.field_1.a;
          if (numparam < 9) {
            pVVar19 = defaultparam->Array;
            if ((pVVar19[8].field_0.field_3.Type != '\x03') ||
               ((pVVar18 = pVVar19 + 8, pVVar19[8].field_0.field_1.atag != 1 &&
                ((pVVar18->field_0).field_1.a != (void *)0x0)))) {
              pcVar21 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
              ;
              goto LAB_003ceb8f;
            }
          }
          else if ((param[8].field_0.field_3.Type != '\x03') ||
                  ((pVVar18 = param + 8, param[8].field_0.field_1.atag != 1 &&
                   ((pVVar18->field_0).field_1.a != (void *)0x0)))) {
            pcVar21 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
LAB_003ceb8f:
            __assert_fail(pcVar21,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x8d5,
                          "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_f8 = (PClassActor *)(pVVar18->field_0).field_1.a;
          if (numparam < 10) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[9].field_0.field_3.Type != '\x01') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003ceca6;
            }
          }
          else {
            pVVar19 = param;
            if (param[9].field_0.field_3.Type != '\x01') {
              pcVar21 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ceca6:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d6,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          dVar23 = pVVar19[9].field_0.f;
          if (numparam < 0xb) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[10].field_0.field_3.Type != '\x01') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003cecc5;
            }
          }
          else {
            pVVar19 = param;
            if (param[10].field_0.field_3.Type != '\x01') {
              pcVar21 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cecc5:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d7,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          dVar24 = pVVar19[10].field_0.f;
          if (numparam < 0xc) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[0xb].field_0.field_3.Type != '\x01') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003cece4;
            }
          }
          else {
            pVVar19 = param;
            if (param[0xb].field_0.field_3.Type != '\x01') {
              pcVar21 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cece4:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d8,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          dVar1 = pVVar19[0xb].field_0.f;
          if (numparam < 0xd) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[0xc].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003ced03;
            }
          }
          else {
            pVVar19 = param;
            if (param[0xc].field_0.field_3.Type != '\0') {
              pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003ced03:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8d9,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar10 = pVVar19[0xc].field_0.i;
          if (numparam < 0xe) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[0xd].field_0.field_3.Type != '\x01') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003ced22;
            }
          }
          else {
            pVVar19 = param;
            if (param[0xd].field_0.field_3.Type != '\x01') {
              pcVar21 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ced22:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8da,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          dVar25 = pVVar19[0xd].field_0.f;
          uVar26 = 0;
          if (numparam < 0xf) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[0xe].field_0.field_3.Type != '\x01') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003ced41;
            }
          }
          else {
            pVVar19 = param;
            if (param[0xe].field_0.field_3.Type != '\x01') {
              pcVar21 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ced41:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8db,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_100 = pVVar19[0xe].field_0.field_1.a;
          if (numparam < 0x10) {
            pVVar19 = defaultparam->Array;
            if ((pVVar19[0xf].field_0.field_3.Type != '\x03') ||
               ((pVVar18 = pVVar19 + 0xf, pVVar19[0xf].field_0.field_1.atag != 1 &&
                ((pVVar18->field_0).field_1.a != (void *)0x0)))) {
              pcVar21 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
              ;
              goto LAB_003cebae;
            }
          }
          else if ((param[0xf].field_0.field_3.Type != '\x03') ||
                  ((pVVar18 = param + 0xf, param[0xf].field_0.field_1.atag != 1 &&
                   ((pVVar18->field_0).field_1.a != (void *)0x0)))) {
            pcVar21 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
LAB_003cebae:
            __assert_fail(pcVar21,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x8dc,
                          "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_130 = (PClassActor *)(pVVar18->field_0).field_1.a;
          if (numparam < 0x11) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[0x10].field_0.field_3.Type != '\x01') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003ced60;
            }
          }
          else {
            pVVar19 = param;
            if (param[0x10].field_0.field_3.Type != '\x01') {
              pcVar21 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003ced60:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8dd,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_108 = pVVar19[0x10].field_0.field_1.a;
          if (numparam < 0x12) {
            pVVar19 = defaultparam->Array;
            if (pVVar19[0x11].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003ced7f;
            }
          }
          else {
            pVVar19 = param;
            if (param[0x11].field_0.field_3.Type != '\0') {
              pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003ced7f:
              __assert_fail(pcVar21,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x8de,
                            "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar11 = pVVar19[0x11].field_0.i;
          if (numparam < 0x13) {
            if (defaultparam->Array[0x12].field_0.field_3.Type != '\0') {
              pcVar21 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003ced9e;
            }
          }
          else if (param[0x12].field_0.field_3.Type != '\0') {
            pcVar21 = "(param[paramnum]).Type == REGT_INT";
LAB_003ced9e:
            __assert_fail(pcVar21,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x8df,
                          "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_110 = (other->__Pos).X;
          local_118 = (other->__Pos).Y;
          local_128 = (other->__Pos).Z;
          local_198 = (AActor *)(other->Angles).Yaw.Degrees;
          local_120 = (other->Angles).Pitch.Degrees;
          if (iVar9 != 0) {
            pAVar20 = (other->target).field_0.p;
            if (pAVar20 == (AActor *)0x0) {
              return 0;
            }
            if (((pAVar20->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
              (other->target).field_0.p = (AActor *)0x0;
              return 0;
            }
          }
          uVar15 = (other->flags).Value;
          if ((uVar15 >> 0x1e & 1) != 0) {
            other->visdir = '\x01';
          }
          local_160._8_8_ = -(ulong)(dVar1 == 0.0);
          local_160._24_8_ = -(ulong)(dVar25 == 0.0);
          uStack_140 = 0;
          (other->flags).Value = uVar15 & 0xffffffdf;
          if (iVar9 == 0) {
            pAVar20 = (AActor *)0x0;
            local_160._0_8_ = local_198;
          }
          else {
            pAVar20 = (other->target).field_0.p;
            uStack_140 = 0;
            local_160._16_8_ = 0.0;
            uStack_e0 = 0;
            if ((pAVar20 != (AActor *)0x0) &&
               (((pAVar20->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (other->target).field_0.p = (AActor *)0x0;
              pAVar20 = (AActor *)0x0;
            }
            local_e8 = dVar25;
            AActor::AngleTo((AActor *)&p,other,SUB81(pAVar20,0));
            (other->Angles).Yaw.Degrees = (double)p.source;
            local_160._0_8_ = p.source;
            pAVar20 = (other->target).field_0.p;
            dVar25 = local_e8;
            uVar26 = uStack_e0;
          }
          local_168 = 0x404e000000000000;
          local_160._16_8_ = 0.0;
          uStack_140 = ~uStack_140 & uVar26;
          if ((pAVar20 != (AActor *)0x0) &&
             (((pAVar20->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            pAVar20 = (AActor *)0x0;
          }
          local_160._8_8_ = ~local_160._8_8_ & (ulong)dVar1 | local_160._8_8_ & 0x40c0000000000000;
          local_160._24_8_ =
               ~local_160._24_8_ & (ulong)dVar25 | local_160._24_8_ & 0x3ff0000000000000;
          P_AimLineAttack((AActor *)&p,(DAngle *)other,2048.0,(FTranslatedLineTarget *)local_160,
                          (DAngle *)&t,(int)&local_168,(AActor *)0x0,pAVar20);
          (other->Angles).Pitch.Degrees = (double)p.source;
          if ((iVar9 != 0) && (t.linetarget == (AActor *)0x0)) {
            pAVar20 = (other->target).field_0.p;
            if ((pAVar20 != (AActor *)0x0) &&
               (((pAVar20->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (other->target).field_0.p = (AActor *)0x0;
            }
            AActor::Vec2To((AActor *)&p,other);
            pAVar20 = (other->target).field_0.p;
            dVar1 = pAVar20->Height;
            dVar25 = (pAVar20->__Pos).Z;
            dVar2 = other->Height;
            dVar3 = (other->__Pos).Z;
            dVar4 = other->Floorclip;
            x = c_sqrt((double)CONCAT44(p._12_4_,p.damage) * (double)CONCAT44(p._12_4_,p.damage) +
                       (double)p.source * (double)p.source);
            dVar1 = c_atan2(((dVar1 * 0.5 + dVar25) - (dVar2 * 0.5 + dVar3)) - dVar4,x);
            (other->Angles).Pitch.Degrees = dVar1 * -57.29577951308232;
          }
          if (iVar9 != 0) {
            pAVar20 = (other->target).field_0.p;
            if ((pAVar20 != (AActor *)0x0) &&
               (((pAVar20->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (other->target).field_0.p = (AActor *)0x0;
              pAVar20 = (AActor *)0x0;
            }
            pAVar12 = (other->target).field_0.p;
            AActor::AngleTo((AActor *)&p,other,(pAVar12->Vel).X * -3.0,(pAVar12->Vel).Y * -3.0,
                            SUB81(pAVar20,0));
            (other->Angles).Yaw.Degrees = (double)p.source;
            local_198 = p.source;
            if (iVar9 == 2) {
              dVar1 = FFastTrig::cos(&fasttrig,
                                     (double)p.source * 11930464.711111112 + 6755399441055744.0);
              dVar25 = FFastTrig::sin(&fasttrig,
                                      (other->Angles).Yaw.Degrees * 11930464.711111112 +
                                      6755399441055744.0);
              P_GetOffsetPosition((other->__Pos).X,(other->__Pos).Y,dVar1 * (double)iVar5,
                                  (double)iVar5 * dVar25);
              (other->__Pos).X = (double)p.source;
              (other->__Pos).Y = (double)CONCAT44(p._12_4_,p.damage);
              pAVar20 = (other->target).field_0.p;
              if ((pAVar20 != (AActor *)0x0) &&
                 (((pAVar20->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (other->target).field_0.p = (AActor *)0x0;
                pAVar20 = (AActor *)0x0;
              }
              pAVar12 = (other->target).field_0.p;
              iVar5 = 0;
              AActor::AngleTo((AActor *)&p,other,(pAVar12->Vel).X * -3.0,(pAVar12->Vel).Y * -3.0,
                              SUB81(pAVar20,0));
              (other->Angles).Yaw.Degrees = (double)p.source;
            }
            if (((((other->target).field_0.p)->flags).Value & 0x40000) != 0) {
              uVar15 = FRandom::GenRand32(&pr_crailgun);
              uVar16 = FRandom::GenRand32(&pr_crailgun);
              (other->Angles).Yaw.Degrees =
                   (double)(int)((uVar15 & 0xff) - (uVar16 & 0xff)) * 0.17578125 +
                   (other->Angles).Yaw.Degrees;
            }
          }
          if ((uVar8 & 4) == 0) {
            uVar15 = FRandom::GenRand32(&pr_crailgun);
            uVar16 = FRandom::GenRand32(&pr_crailgun);
            dVar23 = (dVar23 * (double)(int)((uVar15 & 0xff) - (uVar16 & 0xff))) / 255.0;
            uVar15 = FRandom::GenRand32(&pr_crailgun);
            uVar16 = FRandom::GenRand32(&pr_crailgun);
            dVar24 = (dVar24 * (double)(int)((uVar15 & 0xff) - (uVar16 & 0xff))) / 255.0;
          }
          p.limit = 0;
          p.offset_xy = (double)iVar5;
          p.offset_z = (double)local_108;
          p.color2 = iVar7;
          p.color1 = iVar6;
          p.maxdiff = (double)local_f0;
          p.puff = local_f8;
          p.distance = (double)local_160._8_8_;
          p.sparsity = (double)local_160._24_8_;
          p.drift = (double)local_100;
          p.spawnclass = local_130;
          p.source = other;
          p.damage = iVar14;
          p.flags = uVar8;
          p.angleoffset.Degrees = dVar23;
          p.pitchoffset.Degrees = dVar24;
          p.duration = iVar10;
          p.SpiralOffset = iVar11;
          P_RailAttack(&p);
          (other->__Pos).Z = local_128;
          (other->__Pos).Y = local_118;
          (other->__Pos).X = local_110;
          (other->Angles).Yaw.Degrees = (double)local_198;
          (other->Angles).Pitch.Degrees = local_120;
          return 0;
        }
        pcVar21 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar21,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8ce,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar21 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003cebcd:
  __assert_fail(pcVar21,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x8cd,
                "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomRailgun)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(damage);
	PARAM_INT_DEF	(spawnofs_xy)		
	PARAM_COLOR_DEF	(color1)			
	PARAM_COLOR_DEF	(color2)			
	PARAM_INT_DEF	(flags)				
	PARAM_INT_DEF	(aim)				
	PARAM_FLOAT_DEF	(maxdiff)			
	PARAM_CLASS_DEF	(pufftype, AActor)	
	PARAM_ANGLE_DEF	(spread_xy)			
	PARAM_ANGLE_DEF	(spread_z)			
	PARAM_FLOAT_DEF	(range)				
	PARAM_INT_DEF	(duration)			
	PARAM_FLOAT_DEF	(sparsity)			
	PARAM_FLOAT_DEF	(driftspeed)		
	PARAM_CLASS_DEF	(spawnclass, AActor)
	PARAM_FLOAT_DEF	(spawnofs_z)		
	PARAM_INT_DEF	(SpiralOffset)		
	PARAM_INT_DEF	(limit)				

	if (range == 0) range = 8192.;
	if (sparsity == 0) sparsity = 1;

	FTranslatedLineTarget t;

	DVector3 savedpos = self->Pos();
	DAngle saved_angle = self->Angles.Yaw;
	DAngle saved_pitch = self->Angles.Pitch;

	if (aim && self->target == NULL)
	{
		return 0;
	}
	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;


	if (aim)
	{
		self->Angles.Yaw = self->AngleTo(self->target);
	}
	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, aim ? self->target : NULL);
	if (t.linetarget == NULL && aim)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}
	// Let the aim trail behind the player
	if (aim)
	{
		saved_angle = self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

		if (aim == CRF_AIMDIRECT)
		{
			// Tricky: We must offset to the angle of the current position
			// but then change the angle again to ensure proper aim.
			self->SetXY(self->Vec2Offset(
				spawnofs_xy * self->Angles.Yaw.Cos(),
				spawnofs_xy * self->Angles.Yaw.Sin()));
			spawnofs_xy = 0;
			self->Angles.Yaw = self->AngleTo(self->target,- self->target->Vel.X * 3, -self->target->Vel.Y * 3);
		}

		if (self->target->flags & MF_SHADOW)
		{
			DAngle rnd = pr_crailgun.Random2() * (45. / 256.);
			self->Angles.Yaw += rnd;
		}
	}

	if (!(flags & CRF_EXPLICITANGLE))
	{
		spread_xy = spread_xy * pr_crailgun.Random2() / 255;
		spread_z = spread_z * pr_crailgun.Random2() / 255;
	}

	FRailParams p;
	p.source = self;
	p.damage = damage;
	p.offset_xy = spawnofs_xy;
	p.offset_z = spawnofs_z;
	p.color1 = color1;
	p.color2 = color2;
	p.maxdiff = maxdiff;
	p.flags = flags;
	p.puff = pufftype;
	p.angleoffset = spread_xy;
	p.pitchoffset = spread_z;
	p.distance = range;
	p.duration = duration;
	p.sparsity = sparsity;
	p.drift = driftspeed;
	p.spawnclass = spawnclass;
	p.SpiralOffset = SpiralOffset;
	p.limit = 0;
	P_RailAttack(&p);

	self->SetXYZ(savedpos);
	self->Angles.Yaw = saved_angle;
	self->Angles.Pitch = saved_pitch;
	return 0;
}